

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *__end;
  bool bVar7;
  string text;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_STRING) {
    while ((this_00->current_).type == TYPE_STRING) {
      io::Tokenizer::Next(this_00);
    }
    return true;
  }
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[","");
  bVar4 = TryConsume(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar4) {
    do {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      sVar6 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar6 == local_70._M_string_length) {
        if (sVar6 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70._M_dataplus._M_p,
                       sVar6);
          bVar4 = iVar5 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) {
LAB_002abd67:
        bVar7 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
        sVar6 = (this->tokenizer_).current_.text._M_string_length;
        bVar7 = true;
        if (sVar6 == local_50._M_string_length) {
          if (sVar6 == 0) goto LAB_002abd67;
          iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50._M_dataplus._M_p,
                       sVar6);
          bVar7 = iVar5 != 0;
        }
      }
      if ((!bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar7) {
        bVar4 = SkipFieldValue(this);
      }
      else {
        bVar4 = SkipFieldMessage(this);
      }
      if (bVar4 == false) {
        return false;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"]","");
      bVar4 = TryConsume(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar4) {
        return true;
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,",","");
      bVar4 = Consume(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    } while (bVar4);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
    bVar4 = TryConsume(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    TVar2 = (this_00->current_).type;
    if (TVar2 - TYPE_IDENTIFIER < 3) {
      if (!bVar4 || TVar2 != TYPE_IDENTIFIER) {
LAB_002ac012:
        io::Tokenizer::Next(this_00);
        return true;
      }
      pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,
                 pcVar3 + (this->tokenizer_).current_.text._M_string_length);
      if (local_70._M_string_length != 0) {
        sVar6 = 0;
        do {
          if ((byte)(local_70._M_dataplus._M_p[sVar6] + 0xbfU) < 0x1a) {
            local_70._M_dataplus._M_p[sVar6] = local_70._M_dataplus._M_p[sVar6] | 0x20;
          }
          sVar6 = sVar6 + 1;
        } while (local_70._M_string_length != sVar6);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0))
         || (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        goto LAB_002ac012;
      }
      std::operator+(&local_50,"Invalid float number: ",&local_70);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_50
                 );
    }
    else {
      pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,
                 pcVar3 + (this->tokenizer_).current_.text._M_string_length);
      std::operator+(&local_50,"Cannot skip field value, unexpected token: ",&local_70);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_50
                 );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return false;
}

Assistant:

bool LookingAtType(io::Tokenizer::TokenType token_type) {
    return tokenizer_.current().type == token_type;
  }